

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

int Abc_SuppMinimize(word *pMatrix,Vec_Wrd_t *p,int nBits,int fVerbose)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  uint local_24;
  int i;
  int fVerbose_local;
  int nBits_local;
  Vec_Wrd_t *p_local;
  word *pMatrix_local;
  
  local_24 = 0;
  while (iVar1 = Vec_WrdSize(p), 0 < iVar1) {
    wVar3 = Abc_SuppFindOne(p,nBits);
    pMatrix[(int)local_24] = wVar3;
    Abc_SuppGenFilter(p,nBits);
    if (fVerbose != 0) {
      printf("%2d : ",(ulong)local_24);
      uVar2 = Vec_WrdSize(p);
      printf("%6d  ",(ulong)uVar2);
      Abc_SuppPrintMask(pMatrix[(int)local_24],nBits);
    }
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int Abc_SuppMinimize( word * pMatrix, Vec_Wrd_t * p, int nBits, int fVerbose )
{
    int i;
    for ( i = 0; Vec_WrdSize(p) > 0; i++ )
    {
//        Abc_SuppPrintProfile( p, nBits );
        pMatrix[i] = Abc_SuppFindOne( p, nBits );
        Abc_SuppGenFilter( p, nBits );   
        if ( !fVerbose )
            continue;
        // print stats
        printf( "%2d : ", i );
        printf( "%6d  ", Vec_WrdSize(p) );
        Abc_SuppPrintMask( pMatrix[i], nBits );
//        printf( "\n" );
    }
    return i;
}